

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrespondent.c
# Opt level: O0

int nn_xrespondent_send(nn_sockbase *self,nn_msg *msg)

{
  uint uVar1;
  size_t sVar2;
  uint8_t *buf;
  nn_hash_item *pnVar3;
  char *pcVar4;
  nn_chunkref *in_RSI;
  nn_hash *in_RDI;
  nn_xrespondent_data *data;
  nn_xrespondent *xrespondent;
  uint32_t key;
  int rc;
  size_t in_stack_ffffffffffffffb8;
  FILE *__stream;
  nn_chunkref *in_stack_ffffffffffffffc0;
  nn_msg *msg_00;
  nn_hash *local_38;
  undefined8 in_stack_ffffffffffffffd0;
  uint32_t key_00;
  
  key_00 = (uint32_t)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  local_38 = in_RDI;
  if (in_RDI == (nn_hash *)0x0) {
    local_38 = (nn_hash *)0x0;
  }
  sVar2 = nn_chunkref_size(in_stack_ffffffffffffffc0);
  if (sVar2 < 4) {
    nn_msg_term((nn_msg *)0x15d53d);
  }
  else {
    buf = (uint8_t *)nn_chunkref_data(in_RSI);
    nn_getl(buf);
    nn_chunkref_trim(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    pnVar3 = nn_hash_get(local_38,key_00);
    if (pnVar3 == (nn_hash_item *)0x0) {
      msg_00 = (nn_msg *)0x0;
    }
    else {
      pnVar3 = nn_hash_get(local_38,key_00);
      msg_00 = (nn_msg *)&pnVar3[-1].list.prev;
    }
    if ((msg_00 == (nn_msg *)0x0) ||
       (((undefined1  [32])(msg_00->body).u & (undefined1  [32])0x1) == (undefined1  [32])0x0)) {
      nn_msg_term((nn_msg *)0x15d5d9);
    }
    else {
      uVar1 = nn_pipe_send((nn_pipe *)local_38,msg_00);
      if ((int)uVar1 < 0) {
        nn_backtrace_print();
        __stream = _stderr;
        pcVar4 = nn_err_strerror((int)((ulong)_stderr >> 0x20));
        fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar4,(ulong)-uVar1,
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/protocols/survey/xrespondent.c"
                ,0xb7);
        fflush(_stderr);
        nn_err_abort();
      }
      if ((uVar1 & 1) != 0) {
        *(uint *)&(msg_00->body).u = *(uint *)&(msg_00->body).u & 0xfffffffe;
      }
    }
  }
  return 0;
}

Assistant:

int nn_xrespondent_send (struct nn_sockbase *self, struct nn_msg *msg)
{
    int rc;
    uint32_t key;
    struct nn_xrespondent *xrespondent;
    struct nn_xrespondent_data *data;

    xrespondent = nn_cont (self, struct nn_xrespondent, sockbase);

    /*  We treat invalid peer ID as if the peer was non-existent. */
    if (nn_slow (nn_chunkref_size (&msg->sphdr) < sizeof (uint32_t))) {
        nn_msg_term (msg);
        return 0;
    }

    /*  Retrieve destination peer ID. Trim it from the header. */
    key = nn_getl (nn_chunkref_data (&msg->sphdr));
    nn_chunkref_trim (&msg->sphdr, 4);

    /*  Find the appropriate pipe to send the message to. If there's none,
        or if it's not ready for sending, silently drop the message. */
    data = nn_cont (nn_hash_get (&xrespondent->outpipes, key),
        struct nn_xrespondent_data, outitem);
    if (!data || !(data->flags & NN_XRESPONDENT_OUT)) {
        nn_msg_term (msg);
        return 0;
    }

    /*  Send the message. */
    rc = nn_pipe_send (data->pipe, msg);
    errnum_assert (rc >= 0, -rc);
    if (rc & NN_PIPE_RELEASE)
        data->flags &= ~NN_XRESPONDENT_OUT;

    return 0;
}